

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log.cpp
# Opt level: O3

int main(void)

{
  _Atomic_word *p_Var1;
  char cVar2;
  level_type lVar3;
  int iVar4;
  shared_ptr *psVar5;
  ostream *poVar6;
  char *pcVar7;
  weak_ptr *pwVar8;
  file *pfVar9;
  long lVar10;
  runtime_error *prVar11;
  ifstream ifs;
  shared_ptr<booster::log::sink> s;
  shared_ptr<booster::log::sinks::file> f;
  string line;
  ostringstream oss_24;
  file *local_428;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_420;
  file local_418 [16];
  int aiStack_408 [122];
  file *local_220;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  file *local_210;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_208;
  undefined1 *local_200;
  undefined8 local_1f8;
  undefined1 local_1f0 [16];
  string local_1e0 [32];
  string local_1c0 [376];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_220 = (file *)operator_new(8);
  ((sink *)&local_220->field_0x0)->_vptr_sink = (_func_int **)&PTR_log_00109c08;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<my_sink*>
            (&local_218,(my_sink *)local_220);
  psVar5 = (shared_ptr *)booster::log::logger::instance();
  booster::log::logger::add_sink(psVar5);
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x0);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_428,emergency,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x2b);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Test",4);
    booster::log::message::~message((message *)&local_428);
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x2c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," called",7);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = std::__cxx11::string::compare((char *)&last_message_abi_cxx11_);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," last_message == \"Test\"",0x17);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_428 = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"test","");
  iVar4 = std::__cxx11::string::compare((char *)&local_428);
  if (local_428 != local_418) {
    operator_delete(local_428);
  }
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," last_module==std::string(\"test\")",0x21);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (last_level != emergency) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," last_level ==bl::emergency",0x1b);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0xa);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_428,alert,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x31);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    booster::log::message::~message((message *)&local_428);
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," called",7);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (last_level != alert) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," last_level==bl::alert",0x16);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_428,error,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x35);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    booster::log::message::~message((message *)&local_428);
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x36);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," called",7);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (last_level != error) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x37);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," last_level==bl::error",0x16);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_428,warning,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x39);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    booster::log::message::~message((message *)&local_428);
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x3a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," !called",8);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_428,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x3c);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    booster::log::message::~message((message *)&local_428);
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x3d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," !called",8);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x46);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_428,debug,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x3f);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    booster::log::message::~message((message *)&local_428);
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," !called",8);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_default_level(lVar3);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_428,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x43);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    booster::log::message::~message((message *)&local_428);
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," called",7);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x3c);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_428,info,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x46);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    booster::log::message::~message((message *)&local_428);
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x47);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," !called",8);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_log_level(lVar3,(char *)0x1e);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_428,error,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x4a);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    booster::log::message::~message((message *)&local_428);
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x4b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," called",7);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_428,warning,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x4d);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    booster::log::message::~message((message *)&local_428);
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x4e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," !called",8);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_log_level(lVar3,(char *)0x28);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_428,warning,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x51);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    booster::log::message::~message((message *)&local_428);
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," called",7);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_428,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x54);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    booster::log::message::~message((message *)&local_428);
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x55);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," !called",8);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_1c0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
  pcVar7 = (char *)booster::log::logger::instance();
  booster::log::logger::reset_log_level(pcVar7);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_428,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x58);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    booster::log::message::~message((message *)&local_428);
  }
  if (called != false) {
    called = false;
    last_module = "";
    last_level = all;
    std::__cxx11::string::_M_replace
              (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
    lVar3 = booster::log::logger::instance();
    cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x3c);
    if (cVar2 != '\0') {
      booster::log::message::message
                ((message *)&local_428,info,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x5b);
      poVar6 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
      booster::log::message::~message((message *)&local_428);
    }
    if (called != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x5c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," !called",8);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_1c0);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    called = false;
    last_module = "";
    last_level = all;
    std::__cxx11::string::_M_replace
              (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
    lVar3 = booster::log::logger::instance();
    cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x3c);
    if (cVar2 != '\0') {
      booster::log::message::message
                ((message *)&local_428,info,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x5e);
      poVar6 = (ostream *)booster::log::message::out();
      never_called_called = true;
      std::ostream::operator<<(poVar6,10);
      booster::log::message::~message((message *)&local_428);
    }
    if (called != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x5f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," !called",8);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_1c0);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (never_called_called == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," !never_called_called",0x15);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_1c0);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    called = false;
    last_module = "";
    last_level = all;
    std::__cxx11::string::_M_replace
              (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
    pwVar8 = (weak_ptr *)booster::log::logger::instance();
    local_428 = local_220;
    local_420 = local_218._M_pi;
    if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_218._M_pi)->_M_weak_count = (local_218._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_218._M_pi)->_M_weak_count = (local_218._M_pi)->_M_weak_count + 1;
      }
    }
    booster::log::logger::remove_sink(pwVar8);
    if (local_420 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &local_420->_M_weak_count;
        iVar4 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar4 = local_420->_M_weak_count;
        local_420->_M_weak_count = iVar4 + -1;
      }
      if (iVar4 == 1) {
        (*local_420->_vptr__Sp_counted_base[3])();
      }
    }
    lVar3 = booster::log::logger::instance();
    cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if (cVar2 != '\0') {
      booster::log::message::message
                ((message *)&local_428,error,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,99);
      poVar6 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"message",7);
      booster::log::message::~message((message *)&local_428);
    }
    if (called != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,100);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," !called",8);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_1c0);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    called = false;
    last_module = "";
    last_level = all;
    std::__cxx11::string::_M_replace
              (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
    psVar5 = (shared_ptr *)booster::log::logger::instance();
    booster::log::logger::add_sink(psVar5);
    lVar3 = booster::log::logger::instance();
    cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if (cVar2 != '\0') {
      booster::log::message::message
                ((message *)&local_428,error,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x67);
      poVar6 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"message",7);
      booster::log::message::~message((message *)&local_428);
    }
    if (called == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," called",7);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_1c0);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    called = false;
    last_module = "";
    last_level = all;
    std::__cxx11::string::_M_replace
              (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
    booster::log::logger::instance();
    booster::log::logger::remove_all_sinks();
    lVar3 = booster::log::logger::instance();
    cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if (cVar2 != '\0') {
      booster::log::message::message
                ((message *)&local_428,error,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6b);
      poVar6 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"message",7);
      booster::log::message::~message((message *)&local_428);
    }
    if (called != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," !called",8);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_1c0);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    called = false;
    last_module = "";
    last_level = all;
    std::__cxx11::string::_M_replace
              (0x10a1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x107010);
    pfVar9 = (file *)operator_new(0x30);
    booster::log::sinks::file::file(pfVar9);
    local_210 = pfVar9;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<booster::log::sinks::file*>
              (&local_208,pfVar9);
    pfVar9 = local_210;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"test.log","");
    booster::log::sinks::file::open(pfVar9,local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    psVar5 = (shared_ptr *)booster::log::logger::instance();
    local_428 = local_210;
    local_420 = local_208._M_pi;
    if (local_208._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_208._M_pi)->_M_use_count = (local_208._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_208._M_pi)->_M_use_count = (local_208._M_pi)->_M_use_count + 1;
      }
    }
    booster::log::logger::add_sink(psVar5);
    if (local_420 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_420);
    }
    lVar3 = booster::log::logger::instance();
    cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if (cVar2 != '\0') {
      booster::log::message::message
                ((message *)&local_428,error,"module",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x72);
      poVar6 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Message ",8);
      std::ostream::_M_insert<double>(3.14159);
      booster::log::message::~message((message *)&local_428);
    }
    std::ifstream::ifstream(&local_428,"test.log",_S_in);
    if (*(int *)((long)aiStack_408 + *(long *)(local_428 + -0x18)) == 0) {
      local_1f8 = 0;
      local_1f0[0] = 0;
      local_200 = local_1f0;
      cVar2 = std::ios::widen((char)&local_428 + (char)*(undefined8 *)(local_428 + -0x18));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_428,(string *)&local_200,cVar2);
      lVar10 = std::__cxx11::string::find((char *)&local_200,0x10715b,0);
      if (lVar10 == -1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                   ,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x77);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," line.find(\"Message \")!=std::string::npos",0x29);
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar11,local_1e0);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar10 = std::__cxx11::string::find((char *)&local_200,0x107154,0);
      if (lVar10 != -1) {
        lVar10 = std::__cxx11::string::find((char *)&local_200,0x1071c2,0);
        if (lVar10 != -1) {
          if (local_200 != local_1f0) {
            operator_delete(local_200);
          }
          std::ifstream::~ifstream(&local_428);
          if (local_208._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_208._M_pi);
          }
          if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
          std::ostream::put('(');
          std::ostream::flush();
          return 0;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                   ,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x79);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," line.find(\"3.14159\")!=std::string::npos",0x28);
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar11,local_1e0);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x78);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6," line.find(\"module\")!=std::string::npos",0x27);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_1e0);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ifs.good()",0xb);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,(string *)&local_200);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_428,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
             ,0x6a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,":",1);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_428,0x59);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," called",7);
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar11,local_1c0);
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		namespace bl = booster::log;
		booster::shared_ptr<bl::sink> s(new my_sink);
		bl::logger::instance().add_sink(s);
		reset();
		BOOSTER_EMERG("test") << "Test";
		TEST(called);
		TEST(last_message == "Test");
		TEST(last_module==std::string("test"));
		TEST(last_level ==bl::emergency);
		reset();
		BOOSTER_ALERT("test") << "x";
		TEST(called);
		TEST(last_level==bl::alert);
		reset();
		BOOSTER_ERROR("test") << "x";
		TEST(called);
		TEST(last_level==bl::error);
		reset();
		BOOSTER_WARNING("test") << "x";
		TEST(!called);
		reset();
		BOOSTER_NOTICE("test") << "x";
		TEST(!called);
		reset();
		BOOSTER_DEBUG("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().set_default_level(bl::notice);
		BOOSTER_NOTICE("test") << "x";
		TEST(called);
		reset();
		BOOSTER_INFO("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().set_log_level(bl::error,"test");
		BOOSTER_ERROR("test") << "x";
		TEST(called);
		reset();
		BOOSTER_WARNING("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().set_log_level(bl::warning,"test");
		BOOSTER_WARNING("test") << "x";
		TEST(called);
		reset();
		BOOSTER_NOTICE("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().reset_log_level("test");
		BOOSTER_NOTICE("test") << "x";
		TEST(called);
		reset();
		BOOSTER_INFO("test") << "x";
		TEST(!called);
		reset();
		BOOSTER_INFO("test") << never_called();
		TEST(!called);
		TEST(!never_called_called);
		reset();
		bl::logger::instance().remove_sink(s);
		BOOSTER_ERROR("test") << "message";
		TEST(!called);
		reset();
		bl::logger::instance().add_sink(s);
		BOOSTER_ERROR("test") << "message";
		TEST(called);
		reset();
		bl::logger::instance().remove_all_sinks();
		BOOSTER_ERROR("test") << "message";
		TEST(!called);
		reset();

		booster::shared_ptr<bl::sinks::file> f(new bl::sinks::file());
		f->open("test.log");
		bl::logger::instance().add_sink(f);
		BOOSTER_ERROR("module") << "Message " << 3.14159;
		std::ifstream ifs("test.log");
		TEST(ifs.good());
		std::string line;
		std::getline(ifs,line);
		TEST(line.find("Message ")!=std::string::npos);
		TEST(line.find("module")!=std::string::npos);
		TEST(line.find("3.14159")!=std::string::npos);
	}
	catch(std::exception const &e)
	{
		std::cerr << "Fail: " <<e.what() << std::endl;
		return 1;
	}
	
	std::cout << "Ok" << std::endl;

	return 0;
}